

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode process_zlib_error(connectdata *conn,z_stream *z)

{
  CURLcode extraout_EAX;
  CURLcode extraout_EAX_00;
  
  if (z->msg != (char *)0x0) {
    Curl_failf(conn->data,"Error while processing content unencoding: %s");
    return extraout_EAX;
  }
  Curl_failf(conn->data,
             "Error while processing content unencoding: Unknown failure within decompression software."
            );
  return extraout_EAX_00;
}

Assistant:

static CURLcode
process_zlib_error(struct connectdata *conn, z_stream *z)
{
  struct Curl_easy *data = conn->data;
  if(z->msg)
    failf(data, "Error while processing content unencoding: %s",
          z->msg);
  else
    failf(data, "Error while processing content unencoding: "
          "Unknown failure within decompression software.");

  return CURLE_BAD_CONTENT_ENCODING;
}